

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

iterator * __thiscall
NNTreeImpl::insert(iterator *__return_storage_ptr__,NNTreeImpl *this,QPDFObjectHandle *key,
                  QPDFObjectHandle *value)

{
  NNTreeDetails *pNVar1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  pointer pTVar4;
  QPDFObjectHandle items;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a0;
  iterator iter;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
  find(&iter,this,(QPDFObjectHandle *)&local_a0,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  if (iter.item_number < 0) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)value);
    insertFirst(__return_storage_ptr__,this,(QPDFObjectHandle *)&local_b0,
                (QPDFObjectHandle *)&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  }
  else {
    pNVar1 = this->details;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_100,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
    pTVar4 = NNTreeIterator::operator->(&iter);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pTVar4);
    iVar3 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_100,&local_d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
    if (iVar3 == 0) {
      (*(code *)**(undefined8 **)this->details)();
      QPDFObjectHandle::getKey(&items,(string *)&iter.node);
      QPDFObjectHandle::setArrayItem(&items,iter.item_number + 1,value);
      NNTreeIterator::updateIValue(&iter,true);
      p_Var2 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&items.super_BaseHandle;
    }
    else {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_f0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)value);
      NNTreeIterator::insertAfter(&iter,(QPDFObjectHandle *)&local_e0,(QPDFObjectHandle *)&local_f0)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
      p_Var2 = &local_e0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
    NNTreeIterator::NNTreeIterator(__return_storage_ptr__,&iter);
  }
  NNTreeIterator::~NNTreeIterator(&iter);
  return __return_storage_ptr__;
}

Assistant:

NNTreeImpl::iterator
NNTreeImpl::insert(QPDFObjectHandle key, QPDFObjectHandle value)
{
    auto iter = find(key, true);
    if (!iter.valid()) {
        QTC::TC("qpdf", "NNTree insert inserts first");
        return insertFirst(key, value);
    } else if (details.compareKeys(key, iter->first) == 0) {
        QTC::TC("qpdf", "NNTree insert replaces");
        auto items = iter.node.getKey(details.itemsKey());
        items.setArrayItem(iter.item_number + 1, value);
        iter.updateIValue();
    } else {
        QTC::TC("qpdf", "NNTree insert inserts after");
        iter.insertAfter(key, value);
    }
    return iter;
}